

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

String * __thiscall
Json::(anonymous_namespace)::valueToString_abi_cxx11_
          (String *__return_storage_ptr__,_anonymous_namespace_ *this,double value,
          bool useSpecialFloats,uint precision,PrecisionType precisionType)

{
  uint uVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  long lVar3;
  ulong uVar4;
  undefined7 in_register_00000011;
  char *__format;
  allocator local_29;
  double local_28;
  
  if ((ulong)ABS(value) < 0x7ff0000000000000) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    local_28 = value;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'$');
    __format = "%.*f";
    if (precision == 0) {
      __format = "%.*g";
    }
    while( true ) {
      uVar1 = snprintf((__return_storage_ptr__->_M_dataplus)._M_p,
                       __return_storage_ptr__->_M_string_length,__format,local_28,
                       CONCAT71(in_register_00000011,useSpecialFloats) & 0xffffffff);
      if ((int)uVar1 < 0) {
        __assert_fail("len >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/jsoncpp/src/lib_json/json_writer.cpp"
                      ,0x91,
                      "String Json::(anonymous namespace)::valueToString(double, bool, unsigned int, PrecisionType)"
                     );
      }
      if ((ulong)uVar1 < __return_storage_ptr__->_M_string_length) break;
      std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    }
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    _Var2._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
    _Var2 = fixNumericLocale<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                      (_Var2,_Var2._M_current + __return_storage_ptr__->_M_string_length);
    std::__cxx11::string::erase
              (__return_storage_ptr__,_Var2._M_current,
               (__return_storage_ptr__->_M_dataplus)._M_p + __return_storage_ptr__->_M_string_length
              );
    if (precision == 1) {
      _Var2._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
      _Var2 = fixZerosInTheEnd<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                        (_Var2,_Var2._M_current + __return_storage_ptr__->_M_string_length);
      std::__cxx11::string::erase
                (__return_storage_ptr__,_Var2._M_current,
                 (__return_storage_ptr__->_M_dataplus)._M_p +
                 __return_storage_ptr__->_M_string_length);
    }
    lVar3 = std::__cxx11::string::find((char)__return_storage_ptr__,0x2e);
    if (lVar3 == -1) {
      lVar3 = std::__cxx11::string::find((char)__return_storage_ptr__,0x65);
      if (lVar3 == -1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
  }
  else {
    uVar4 = 0;
    if (!NAN(value)) {
      uVar4 = (ulong)((0.0 <= value) + 1);
    }
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               anon_unknown_0::valueToString::reps[(byte)((byte)this ^ 1)][uVar4],&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

String valueToString(double value,
                     bool useSpecialFloats,
                     unsigned int precision,
                     PrecisionType precisionType) {
  // Print into the buffer. We need not request the alternative representation
  // that always has a decimal point because JSON doesn't distinguish the
  // concepts of reals and integers.
  if (!isfinite(value)) {
    static const char* const reps[2][3] = {{"NaN", "-Infinity", "Infinity"},
                                           {"null", "-1e+9999", "1e+9999"}};
    return reps[useSpecialFloats ? 0 : 1]
               [isnan(value) ? 0 : (value < 0) ? 1 : 2];
  }

  String buffer(size_t(36), '\0');
  while (true) {
    int len = jsoncpp_snprintf(
        &*buffer.begin(), buffer.size(),
        (precisionType == PrecisionType::significantDigits) ? "%.*g" : "%.*f",
        precision, value);
    assert(len >= 0);
    auto wouldPrint = static_cast<size_t>(len);
    if (wouldPrint >= buffer.size()) {
      buffer.resize(wouldPrint + 1);
      continue;
    }
    buffer.resize(wouldPrint);
    break;
  }

  buffer.erase(fixNumericLocale(buffer.begin(), buffer.end()), buffer.end());

  // strip the zero padding from the right
  if (precisionType == PrecisionType::decimalPlaces) {
    buffer.erase(fixZerosInTheEnd(buffer.begin(), buffer.end()), buffer.end());
  }

  // try to ensure we preserve the fact that this was given to us as a double on
  // input
  if (buffer.find('.') == buffer.npos && buffer.find('e') == buffer.npos) {
    buffer += ".0";
  }
  return buffer;
}